

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit.cpp
# Opt level: O2

void __thiscall QLineEdit::dropEvent(QLineEdit *this,QDropEvent *e)

{
  QLineEditPrivate *this_00;
  QWidgetLineControl *this_01;
  int iVar1;
  int pos;
  QLineEdit *pQVar2;
  QPoint QVar3;
  int start;
  int iVar4;
  long in_FS_OFFSET;
  QPointF local_68;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QLineEditPrivate **)&(this->super_QWidget).field_0x8;
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QMimeData::text();
  if ((local_58.ptr == (char16_t *)0x0) || ((this_00->control->field_0x50 & 4) != 0)) {
    e[0xc] = (QDropEvent)0x0;
    QWidget::update(&this->super_QWidget);
  }
  else {
    pQVar2 = (QLineEdit *)QDropEvent::source();
    if ((pQVar2 == this) && (*(int *)(e + 0x2c) == 1)) {
      deselect(this);
    }
    local_68.xp = *(qreal *)(e + 0x10);
    local_68.yp = *(qreal *)(e + 0x18);
    QVar3 = QPointF::toPoint(&local_68);
    pos = QLineEditPrivate::xToPos(this_00,QVar3.xp.m_i.m_i,CursorBetweenCharacters);
    this_01 = this_00->control;
    iVar4 = -1;
    iVar1 = iVar4;
    if ((this_01->m_text).d.size != 0 && this_01->m_selstart < this_01->m_selend) {
      iVar4 = this_01->m_selend;
      iVar1 = this_01->m_selstart;
    }
    QWidgetLineControl::moveCursor((QWidgetLineControl *)this_01,pos,false);
    this_00->field_0x27c = this_00->field_0x27c & 0xfb;
    *(undefined4 *)(e + 0x2c) = *(undefined4 *)(e + 0x30);
    e[0xc] = (QDropEvent)0x1;
    insert(this,(QString *)&local_58);
    pQVar2 = (QLineEdit *)QDropEvent::source();
    if (pQVar2 == this) {
      start = pos;
      if ((*(int *)(e + 0x2c) == 2) &&
         (((pos <= iVar1 || (start = iVar1, iVar4 < pos)) && (start = pos, iVar4 < pos)))) {
        start = pos - (int)local_58.size;
      }
      setSelection(this,start,(int)local_58.size);
    }
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLineEdit::dropEvent(QDropEvent* e)
{
    Q_D(QLineEdit);
    QString str = e->mimeData()->text();

    if (!str.isNull() && !d->control->isReadOnly()) {
        if (e->source() == this && e->dropAction() == Qt::CopyAction)
            deselect();
        int cursorPos = d->xToPos(e->position().toPoint().x());
        int selStart = cursorPos;
        int oldSelStart = d->control->selectionStart();
        int oldSelEnd = d->control->selectionEnd();
        d->control->moveCursor(cursorPos, false);
        d->cursorVisible = false;
        e->acceptProposedAction();
        insert(str);
        if (e->source() == this) {
            if (e->dropAction() == Qt::MoveAction) {
                if (selStart > oldSelStart && selStart <= oldSelEnd)
                    setSelection(oldSelStart, str.size());
                else if (selStart > oldSelEnd)
                    setSelection(selStart - str.size(), str.size());
                else
                    setSelection(selStart, str.size());
            } else {
                setSelection(selStart, str.size());
            }
        }
    } else {
        e->ignore();
        update();
    }
}